

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O3

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::Assemble
          (TPZStructMatrixOR<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long lVar1;
  TPZReference *pTVar2;
  long lVar3;
  complex<double> *__s;
  long lVar4;
  TPZAutoPointer<TPZGuiInterface> *pTVar5;
  ulong uVar6;
  TPZFMatrix<std::complex<double>_> rhsloc;
  TPZAutoPointer<TPZGuiInterface> local_e8;
  TPZAutoPointer<TPZGuiInterface> local_e0;
  long local_d8;
  TPZAutoPointer<TPZGuiInterface> local_d0;
  TPZAutoPointer<TPZGuiInterface> local_c8;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  lVar3 = __dynamic_cast(this,&TPZStructMatrixOR<std::complex<double>>::typeinfo,
                         &TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::start(&ass_stiff.stats);
  }
  if (*(char *)(lVar3 + 0x58) == '\x01') {
    lVar1 = *(long *)(lVar3 + 0x70);
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
    local_c0.fElem = (complex<double> *)0x0;
    local_c0.fGiven = (complex<double> *)0x0;
    local_c0.fSize = 0;
    TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
    local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
    local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
    local_c0.fWork.fStore = (complex<double> *)0x0;
    local_c0.fWork.fNElements = 0;
    local_c0.fWork.fNAlloc = 0;
    lVar4 = *(long *)(*(long *)this + -0x60);
    if ((&this->field_0xc)[lVar4] == '\x01') {
      lVar4 = rhs->fCol;
      uVar6 = lVar4 * lVar1;
      __s = local_c0.fElem;
      if (uVar6 - local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol *
                  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow != 0) {
        if (local_c0.fElem != local_c0.fGiven && local_c0.fElem != (complex<double> *)0x0) {
          operator_delete__(local_c0.fElem);
        }
        if ((local_c0.fGiven == (complex<double> *)0x0) ||
           (__s = local_c0.fGiven, uVar6 - local_c0.fSize != 0 && local_c0.fSize <= (long)uVar6)) {
          if (uVar6 == 0) {
            __s = (complex<double> *)0x0;
          }
          else {
            local_d8 = lVar4;
            __s = (complex<double> *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | uVar6 * 0x10);
            memset(__s,0,uVar6 * 0x10);
            lVar4 = local_d8;
          }
        }
      }
      local_c0.fElem = __s;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar1;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar4;
      (*local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
      lVar4 = *(long *)(*(long *)this + -0x60);
    }
    pTVar2 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + lVar4) == 0) {
      pTVar5 = &local_d0;
      LOCK();
      (pTVar2->fCounter).super___atomic_base<int>._M_i =
           (pTVar2->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d0.fRef = pTVar2;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,&local_c0,pTVar5);
    }
    else {
      pTVar5 = &local_c8;
      LOCK();
      (pTVar2->fCounter).super___atomic_base<int>._M_i =
           (pTVar2->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_c8.fRef = pTVar2;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,&local_c0,pTVar5);
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar5);
    if ((&this->field_0xc)[*(long *)(*(long *)this + -0x60)] == '\x01') {
      TPZEquationFilter::Scatter((TPZEquationFilter *)(lVar3 + 0x48),(TPZBaseMatrix *)&local_c0,rhs)
      ;
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  }
  else {
    pTVar2 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60)) == 0) {
      LOCK();
      (pTVar2->fCounter).super___atomic_base<int>._M_i =
           (pTVar2->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_e8.fRef = pTVar2;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,rhs);
      pTVar5 = &local_e8;
    }
    else {
      LOCK();
      (pTVar2->fCounter).super___atomic_base<int>._M_i =
           (pTVar2->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_e0.fRef = pTVar2;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,rhs);
      pTVar5 = &local_e0;
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar5);
  }
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::stop(&ass_stiff.stats);
  }
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhsloc, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhsloc, guiInterface);
        }

        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    } else {
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhs, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhs, guiInterface);
        }
    }
    ass_stiff.stop();
}